

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

wstring * __thiscall
PDA::Transducer::Identifier::contextToString_abi_cxx11_
          (wstring *__return_storage_ptr__,Identifier *this,Context cnt)

{
  allocator<wchar_t> *__a;
  wchar_t *__s;
  allocator<wchar_t> local_e;
  allocator<wchar_t> local_d;
  allocator<wchar_t> local_c;
  allocator<wchar_t> local_b;
  allocator<wchar_t> local_a;
  allocator<wchar_t> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = L"Default";
    __a = &local_9;
    break;
  case 1:
    __s = L"Declaration";
    __a = &local_d;
    break;
  case 2:
    __s = L"Link";
    __a = &local_b;
    break;
  case 3:
    __s = L"Argument";
    __a = &local_a;
    break;
  case 4:
    __s = L"Literal";
    __a = &local_c;
    break;
  default:
    __s = L"Default";
    __a = &local_e;
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)__return_storage_ptr__,__s,__a)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::wstring Identifier::contextToString(const Identifier::Context cnt)
{
    switch(cnt)
    {
    case Context::Default:
        return L"Default";
    case Context::Argument:
        return L"Argument";
    case Context::Link:
        return L"Link";
    case Context::Literal:
        return L"Literal";
    case Context::Declaration:
        return L"Declaration";
    }
    return L"Default";
}